

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Image * ImageTextEx(Image *__return_storage_ptr__,Font font,char *text,float fontSize,float spacing,
                   Color tint)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Vector2 VVar7;
  undefined1 auVar8 [16];
  Image src;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  CharInfo *pCVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Rectangle dstRec;
  int codepointByteCount;
  Image *local_a8;
  Color local_a0;
  int local_9c;
  char *local_98;
  size_t local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  uint local_54;
  
  local_a0 = tint;
  local_90 = strlen(text);
  local_98 = text;
  VVar7 = MeasureTextEx(font,text,(float)font.baseSize,spacing);
  local_88 = VVar7.y;
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._0_4_ = VVar7.x;
  local_78._4_4_ = VVar7.y;
  local_78._12_4_ = extraout_XMM0_Dd;
  iVar15 = 0;
  local_a8 = __return_storage_ptr__;
  fStack_84 = local_88;
  fStack_80 = local_88;
  fStack_7c = local_88;
  GenImageColor(__return_storage_ptr__,(int)VVar7.x,(int)local_88,(Color)0x0);
  local_9c = (int)spacing;
  iVar16 = 0;
  iVar17 = 0;
  do {
    if ((int)local_90 <= iVar15) {
      if (local_88 < fontSize) {
        fVar18 = fontSize / local_88;
        TraceLog(3,"IMAGE: Text scaled by factor: %f",SUB84((double)fVar18,0));
        GetFontDefault();
        if (font.texture.id == local_54) {
          ImageResizeNN(local_a8,(int)((float)local_78._0_4_ * fVar18),(int)(fVar18 * local_88));
        }
        else {
          ImageResize(local_a8,(int)((float)local_78._0_4_ * fVar18),(int)(fVar18 * local_88));
        }
      }
      return local_a8;
    }
    codepointByteCount = 0;
    iVar13 = GetNextCodepoint(local_98 + iVar15,&codepointByteCount);
    iVar14 = GetGlyphIndex(font,iVar13);
    if (iVar13 == 9) {
LAB_00136368:
      iVar13 = font.chars[iVar14].advanceX;
      if (iVar13 == 0) {
        iVar13 = (int)(font.recs[iVar14].width + spacing);
      }
      else {
        iVar17 = iVar17 + local_9c;
      }
      iVar17 = iVar17 + iVar13;
    }
    else {
      if (iVar13 != 10) {
        if (iVar13 != 0x20) {
          if (iVar13 == 0x3f) {
            codepointByteCount = 1;
          }
          dstRec.x = (float)(font.chars[iVar14].offsetX + iVar17);
          uVar1 = font.recs[iVar14].width;
          uVar3 = font.recs[iVar14].height;
          dstRec.height = (float)uVar3;
          dstRec.width = (float)uVar1;
          uVar2 = font.chars[iVar14].image.width;
          uVar4 = font.chars[iVar14].image.height;
          uVar5 = font.chars[iVar14].image.mipmaps;
          uVar6 = font.chars[iVar14].image.format;
          src.format = uVar6;
          src.mipmaps = uVar5;
          pCVar12 = font.chars + iVar14;
          uVar9 = (pCVar12->image).data;
          uVar10 = (pCVar12->image).width;
          uVar11 = (pCVar12->image).height;
          src.height = uVar11;
          src.width = uVar10;
          src.data = (void *)uVar9;
          auVar8._4_4_ = (float)(int)uVar4;
          auVar8._0_4_ = (float)(int)uVar2;
          auVar8._8_8_ = 0;
          dstRec.y = (float)(font.chars[iVar14].offsetY + iVar16);
          ImageDraw(local_a8,src,(Rectangle)(auVar8 << 0x40),dstRec,local_a0);
        }
        goto LAB_00136368;
      }
      iVar16 = iVar16 + font.baseSize + font.baseSize / 2;
      iVar17 = 0;
    }
    iVar15 = iVar15 + codepointByteCount;
  } while( true );
}

Assistant:

Image ImageTextEx(Font font, const char *text, float fontSize, float spacing, Color tint)
{
    int length = (int)strlen(text);

    int textOffsetX = 0;            // Image drawing position X
    int textOffsetY = 0;            // Offset between lines (on line break '\n')

    // NOTE: Text image is generated at font base size, later scaled to desired font size
    Vector2 imSize = MeasureTextEx(font, text, (float)font.baseSize, spacing);

    // Create image to store text
    Image imText = GenImageColor((int)imSize.x, (int)imSize.y, BLANK);

    for (int i = 0; i < length; i++)
    {
        // Get next codepoint from byte string and glyph index in font
        int codepointByteCount = 0;
        int codepoint = GetNextCodepoint(&text[i], &codepointByteCount);
        int index = GetGlyphIndex(font, codepoint);

        // NOTE: Normally we exit the decoding sequence as soon as a bad byte is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol moving one byte
        if (codepoint == 0x3f) codepointByteCount = 1;

        if (codepoint == '\n')
        {
            // NOTE: Fixed line spacing of 1.5 line-height
            // TODO: Support custom line spacing defined by user
            textOffsetY += (font.baseSize + font.baseSize/2);
            textOffsetX = 0;
        }
        else
        {
            if ((codepoint != ' ') && (codepoint != '\t'))
            {
                Rectangle rec = { (float)(textOffsetX + font.chars[index].offsetX), (float)(textOffsetY + font.chars[index].offsetY), (float)font.recs[index].width, (float)font.recs[index].height };
                ImageDraw(&imText, font.chars[index].image, (Rectangle){ 0, 0, (float)font.chars[index].image.width, (float)font.chars[index].image.height }, rec, tint);
            }

            if (font.chars[index].advanceX == 0) textOffsetX += (int)(font.recs[index].width + spacing);
            else textOffsetX += font.chars[index].advanceX + (int)spacing;
        }

        i += (codepointByteCount - 1);   // Move text bytes counter to next codepoint
    }

    // Scale image depending on text size
    if (fontSize > imSize.y)
    {
        float scaleFactor = fontSize/imSize.y;
        TRACELOG(LOG_INFO, "IMAGE: Text scaled by factor: %f", scaleFactor);

        // Using nearest-neighbor scaling algorithm for default font
        if (font.texture.id == GetFontDefault().texture.id) ImageResizeNN(&imText, (int)(imSize.x*scaleFactor), (int)(imSize.y*scaleFactor));
        else ImageResize(&imText, (int)(imSize.x*scaleFactor), (int)(imSize.y*scaleFactor));
    }

    return imText;
}